

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O1

Complex __thiscall rtb::Filter::Filter<double>::feedbackCoefficientsProduct(Filter<double> *this)

{
  pointer pcVar1;
  double dVar2;
  complex<double> *in_RAX;
  ulong in_RDX;
  ulong uVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar7;
  Complex CVar8;
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  double local_48;
  undefined8 uStack_40;
  
  uVar3 = this->n_;
  dVar2 = 0.0;
  uVar5 = 0;
  uVar6 = 0;
  dVar7 = 0.0;
  uStack_40 = 0;
  if (1 < uVar3) {
    in_RDX = 1;
    uVar4 = 2;
    do {
      local_58._8_4_ = uVar5;
      local_58._0_8_ = dVar2;
      local_58._12_4_ = uVar6;
      uVar3 = ((uVar3 - in_RDX) + this->count_) % uVar3;
      pcVar1 = (this->y_).
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_48 = dVar7;
      if ((ulong)((long)(this->y_).
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) <= uVar3) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3
                  );
      }
      Polynomial<double>::getCoefficient(&(this->tf_).denominator_,uVar4 - 1);
      pcVar1 = pcVar1 + uVar3;
      local_78 = *(double *)pcVar1->_M_value;
      dStack_70 = *(double *)(pcVar1->_M_value + 8);
      local_68._8_8_ = dVar7;
      in_RAX = std::complex<double>::operator*=
                         ((complex<double> *)&local_78,(complex<double> *)local_68);
      uVar5 = local_58._8_4_;
      uVar6 = local_58._12_4_;
      dVar2 = local_58._0_8_ + local_78;
      dVar7 = local_48 + dStack_70;
      in_RDX = (ulong)uVar4;
      uVar3 = this->n_;
      uVar4 = uVar4 + 1;
    } while (in_RDX < uVar3);
  }
  CVar8._M_value._8_8_ = in_RDX;
  CVar8._M_value._0_8_ = in_RAX;
  return (Complex)CVar8._M_value;
}

Assistant:

typename Filter<T>::Complex Filter<T>::feedbackCoefficientsProduct() const {

            Complex result{ 0 };
            for (unsigned k{ 1 }; k < n_; ++k)
                result += y_.at((n_ - k + count_) % n_)*tf_.a(k);
            return -result;
        }